

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O0

DataViewPtr __thiscall
Rml::Factory::InstanceDataView
          (Factory *this,String *type_name,Element *element,bool is_structural_view)

{
  code *pcVar1;
  bool bVar2;
  FactoryData *pFVar3;
  pointer ppVar4;
  pointer ppVar5;
  iterator local_58;
  undefined1 local_48 [8];
  iterator it_1;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>_>_>_>
  local_30;
  iterator it;
  bool is_structural_view_local;
  Element *element_local;
  String *type_name_local;
  
  it._M_current._7_1_ = is_structural_view;
  if ((element == (Element *)0x0) &&
     (bVar2 = Assert("RMLUI_ASSERT(element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Factory.cpp"
                     ,0x265), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if ((it._M_current._7_1_ & 1) == 0) {
    pFVar3 = ControlledLifetimeResource<Rml::FactoryData>::operator->
                       ((ControlledLifetimeResource<Rml::FactoryData> *)factory_data);
    _local_48 = robin_hood::detail::
                Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&pFVar3->data_view_instancers,type_name);
    pFVar3 = ControlledLifetimeResource<Rml::FactoryData>::operator->
                       ((ControlledLifetimeResource<Rml::FactoryData> *)factory_data);
    local_58 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&pFVar3->data_view_instancers);
    bVar2 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,Rml::DataViewInstancer*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::Iter<false>::operator!=((Iter<false> *)local_48,&local_58);
    if (bVar2) {
      ppVar5 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::Iter<false>::operator->((Iter<false> *)local_48);
      (*ppVar5->second->_vptr_DataViewInstancer[2])(this,ppVar5->second,element);
      return (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)
             (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)this;
    }
  }
  else {
    pFVar3 = ControlledLifetimeResource<Rml::FactoryData>::operator->
                       ((ControlledLifetimeResource<Rml::FactoryData> *)factory_data);
    local_30._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>
          *)itlib::
            flat_map<std::__cxx11::string,Rml::DataViewInstancer*,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::DataViewInstancer*>,std::allocator<std::pair<std::__cxx11::string,Rml::DataViewInstancer*>>>>
            ::find<std::__cxx11::string>
                      ((flat_map<std::__cxx11::string,Rml::DataViewInstancer*,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::DataViewInstancer*>,std::allocator<std::pair<std::__cxx11::string,Rml::DataViewInstancer*>>>>
                        *)&pFVar3->structural_data_view_instancers,type_name);
    pFVar3 = ControlledLifetimeResource<Rml::FactoryData>::operator->
                       ((ControlledLifetimeResource<Rml::FactoryData> *)factory_data);
    it_1.mInfo = (uint8_t *)
                 itlib::
                 flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>_>_>_>
                 ::end(&pFVar3->structural_data_view_instancers);
    bVar2 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>_>_>_>
                        *)&it_1.mInfo);
    if (bVar2) {
      ppVar4 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>_>_>_>
               ::operator->(&local_30);
      (*ppVar4->second->_vptr_DataViewInstancer[2])(this,ppVar4->second,element);
      return (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)
             (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)this;
    }
  }
  ::std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>::
  unique_ptr<Rml::Releaser<Rml::DataView>,void>
            ((unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>> *)this,(nullptr_t)0x0);
  return (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)
         (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)this;
}

Assistant:

DataViewPtr Factory::InstanceDataView(const String& type_name, Element* element, bool is_structural_view)
{
	RMLUI_ASSERT(element);

	if (is_structural_view)
	{
		auto it = factory_data->structural_data_view_instancers.find(type_name);
		if (it != factory_data->structural_data_view_instancers.end())
			return it->second->InstanceView(element);
	}
	else
	{
		auto it = factory_data->data_view_instancers.find(type_name);
		if (it != factory_data->data_view_instancers.end())
			return it->second->InstanceView(element);
	}
	return nullptr;
}